

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-value.c
# Opt level: O3

void test_value_basic(void)

{
  char cVar1;
  undefined8 uVar2;
  long lVar3;
  undefined8 uVar4;
  char *suite;
  int iVar5;
  undefined8 *puVar6;
  bson_t other;
  bson_oid_t oid;
  bson_iter_t iter;
  bson_value_t copy;
  bson_t sub;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined1 auStack_500 [40];
  undefined8 uStack_4d8;
  Test *pTStack_4d0;
  undefined8 uStack_4c8;
  undefined1 *puStack_4c0;
  char *pcStack_4b8;
  Test *pTStack_4b0;
  undefined8 uStack_4a8;
  undefined8 uStack_4a0;
  char *pcStack_498;
  Test *pTStack_490;
  undefined8 uStack_488;
  undefined8 uStack_480;
  char *pcStack_478;
  Test *pTStack_470;
  undefined8 uStack_468;
  char *pcStack_460;
  Test *pTStack_458;
  undefined8 uStack_450;
  char *pcStack_448;
  char *pcStack_440;
  char *pcStack_438;
  Test *pTStack_430;
  undefined8 uStack_428;
  char *pcStack_420;
  undefined1 *puStack_418;
  char *pcStack_410;
  Test *pTStack_408;
  undefined1 auStack_400 [48];
  char *pcStack_3d0;
  Test *pTStack_3c8;
  undefined8 uStack_3c0;
  char *pcStack_3b8;
  undefined8 *puStack_3b0;
  char *pcStack_3a8;
  Test *pTStack_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  char *pcStack_388;
  Test *pTStack_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  char *pcStack_360;
  Test *pTStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  char *pcStack_340;
  Test *pTStack_338;
  undefined8 uStack_330;
  char *pcStack_328;
  Test *pTStack_320;
  undefined8 uStack_318;
  undefined8 *puStack_310;
  code *pcStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined1 local_20c [12];
  undefined8 local_200 [12];
  undefined1 local_1a0 [32];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  
  local_290 = 0;
  uStack_288 = 0;
  local_2a0 = 0;
  uStack_298 = 0;
  local_2b0 = 0;
  uStack_2a8 = 0;
  local_2c0 = 0;
  uStack_2b8 = 0;
  local_2d0 = 0;
  uStack_2c8 = 0;
  local_2e0 = 0;
  uStack_2d8 = 0;
  local_2f0 = 0;
  uStack_2e8 = 0;
  local_300 = 0x500000003;
  uStack_2f8 = 5;
  puVar6 = &local_180;
  local_110 = 0;
  uStack_108 = 0;
  local_120 = 0;
  uStack_118 = 0;
  local_130 = 0;
  uStack_128 = 0;
  local_140 = 0;
  uStack_138 = 0;
  local_150 = 0;
  uStack_148 = 0;
  local_160 = 0;
  uStack_158 = 0;
  local_170 = 0;
  uStack_168 = 0;
  local_180 = 0x500000003;
  uStack_178 = 5;
  pcStack_308 = (code *)0x13787c;
  bson_oid_init(local_20c,0);
  pcStack_308 = (code *)0x137881;
  auStack_500._24_8_ = bson_bcon_magic();
  puStack_310 = (undefined8 *)0x0;
  uStack_318 = 0x14;
  pcStack_328 = "minkey";
  uStack_330 = 0x13;
  pcStack_340 = "maxkey";
  uStack_348 = 0x10e1;
  uStack_350 = 0xf;
  pcStack_360 = "int64";
  uStack_368 = 0x11d7;
  uStack_370 = 0x4d2;
  uStack_378 = 0x10;
  pcStack_388 = "timestamp";
  uStack_390 = 0x4d2;
  uStack_398 = 0xf;
  pcStack_3a8 = "int32";
  pcStack_3b8 = "var a = 1;";
  uStack_3c0 = 0xe;
  pcStack_3d0 = "codewscope";
  auStack_400._40_8_ = "my_symbol";
  auStack_400._32_8_ = (FILE *)0xd;
  auStack_400._16_8_ = "symbol";
  auStack_400._8_8_ = "var a = function() {}";
  auStack_400._0_8_ = (char *)0xc;
  pcStack_410 = "code";
  pcStack_420 = "test.test";
  uStack_428 = 0xb;
  pcStack_438 = "dbpointer";
  pcStack_440 = "i";
  pcStack_448 = "^hello";
  uStack_450 = 10;
  pcStack_460 = "regex";
  uStack_468 = 9;
  pcStack_478 = "null";
  uStack_480 = 0xbc614e;
  uStack_488 = 8;
  pcStack_498 = "datetime";
  uStack_4a0 = 1;
  uStack_4a8 = 7;
  pcStack_4b8 = "bool";
  uStack_4c8 = 6;
  uStack_4d8 = "oid";
  auStack_500._32_8_ = (FILE *)0x5;
  auStack_500._16_8_ = "undefined";
  auStack_500._8_8_ = (char *)0x10;
  auStack_500._0_8_ = "";
  uStack_508 = 0;
  uStack_510 = 4;
  pTStack_4d0 = (Test *)auStack_500._24_8_;
  puStack_4c0 = local_20c;
  pTStack_4b0 = (Test *)auStack_500._24_8_;
  pTStack_490 = (Test *)auStack_500._24_8_;
  pTStack_470 = (Test *)auStack_500._24_8_;
  pTStack_458 = (Test *)auStack_500._24_8_;
  pTStack_430 = (Test *)auStack_500._24_8_;
  puStack_418 = local_20c;
  pTStack_408 = (Test *)auStack_500._24_8_;
  auStack_400._24_8_ = auStack_500._24_8_;
  pTStack_3c8 = (Test *)auStack_500._24_8_;
  puStack_3b0 = puVar6;
  pTStack_3a0 = (Test *)auStack_500._24_8_;
  pTStack_380 = (Test *)auStack_500._24_8_;
  pTStack_358 = (Test *)auStack_500._24_8_;
  pTStack_338 = (Test *)auStack_500._24_8_;
  pTStack_320 = (Test *)auStack_500._24_8_;
  uVar2 = bcon_new(0x9999999a,0,"double",auStack_500._24_8_,1,"utf8","this is my string","document",
                   auStack_500._24_8_,2,puVar6,"array",auStack_500._24_8_,2,puVar6,"binary",
                   auStack_500._24_8_);
  pcStack_308 = (code *)0x137a28;
  cVar1 = bson_iter_init(local_200,uVar2);
  if (cVar1 == '\0') {
LAB_00137ad8:
    pcStack_308 = (code *)0x137add;
    test_value_basic_cold_1();
  }
  else {
    iVar5 = 0x14;
    puVar6 = local_200;
    do {
      pcStack_308 = (code *)0x137a51;
      cVar1 = bson_iter_next(puVar6);
      if (cVar1 == '\0') {
        pcStack_308 = (code *)0x137ace;
        test_value_basic_cold_2();
LAB_00137ace:
        pcStack_308 = (code *)0x137ad3;
        test_value_basic_cold_5();
LAB_00137ad3:
        pcStack_308 = (code *)0x137ad8;
        test_value_basic_cold_3();
        goto LAB_00137ad8;
      }
      pcStack_308 = (code *)0x137a5d;
      lVar3 = bson_iter_value(puVar6);
      if (lVar3 == 0) goto LAB_00137ace;
      pcStack_308 = (code *)0x137a6d;
      bson_value_copy(lVar3,local_1a0);
      pcStack_308 = (code *)0x137a75;
      uVar4 = bson_iter_key(puVar6);
      pcStack_308 = (code *)0x137a88;
      cVar1 = bson_append_value(&local_300,uVar4,0xffffffff,local_1a0);
      if (cVar1 == '\0') goto LAB_00137ad3;
      pcStack_308 = (code *)0x137a94;
      bson_value_destroy(local_1a0);
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
    pcStack_308 = (code *)0x137aa6;
    cVar1 = bson_iter_next(local_200);
    if (cVar1 == '\0') {
      pcStack_308 = (code *)0x137ab2;
      bson_destroy(uVar2);
      pcStack_308 = (code *)0x137aba;
      bson_destroy(&local_300);
      return;
    }
  }
  pcStack_308 = test_value_decimal128;
  test_value_basic_cold_4();
  pTStack_490 = (Test *)0x0;
  uStack_488 = 0;
  uStack_4a0 = 0;
  pcStack_498 = (char *)0x0;
  pTStack_4b0 = (Test *)0x0;
  uStack_4a8 = 0;
  puStack_4c0 = (undefined1 *)0x0;
  pcStack_4b8 = (char *)0x0;
  pTStack_4d0 = (Test *)0x0;
  uStack_4c8 = 0;
  auStack_500._32_8_ = (FILE *)0x0;
  uStack_4d8._0_4_ = 0;
  uStack_4d8._4_4_ = 0;
  auStack_500._16_8_ = (char *)0x0;
  auStack_500._24_8_ = (Test *)0x0;
  auStack_500._0_8_ = (char *)0x500000003;
  auStack_500._8_8_ = (char *)0x5;
  suite = "123.5";
  uStack_318 = uVar2;
  puStack_310 = puVar6;
  pcStack_308 = (code *)&stack0xfffffffffffffff8;
  cVar1 = bson_decimal128_from_string("123.5",&uStack_510);
  if (cVar1 == '\0') {
LAB_00137c39:
    test_value_decimal128_cold_1();
  }
  else {
    uVar2 = bson_bcon_magic();
    uVar2 = bcon_new(0,"decimal128",uVar2,0x12,&uStack_510,0);
    suite = auStack_400;
    cVar1 = bson_iter_init(suite,uVar2);
    if (cVar1 == '\0') {
LAB_00137c34:
      test_value_decimal128_cold_2();
      goto LAB_00137c39;
    }
    suite = auStack_400;
    cVar1 = bson_iter_next();
    if (cVar1 == '\0') goto LAB_00137c34;
    suite = auStack_400;
    lVar3 = bson_iter_value();
    if (lVar3 != 0) {
      bson_value_copy(lVar3,&pcStack_420);
      uVar4 = bson_iter_key(auStack_400);
      suite = auStack_500;
      cVar1 = bson_append_value(suite,uVar4,0xffffffff,&pcStack_420);
      if (cVar1 != '\0') {
        bson_value_destroy(&pcStack_420);
        bson_destroy(uVar2);
        bson_destroy(auStack_500);
        return;
      }
      goto LAB_00137c43;
    }
  }
  test_value_decimal128_cold_4();
LAB_00137c43:
  test_value_decimal128_cold_3();
  TestSuite_Add((TestSuite *)suite,"/version",test_bson_version);
  return;
}

Assistant:

static void
test_value_basic (void)
{
   static const uint8_t raw[16] = {0};
   const bson_value_t *value;
   bson_value_t copy;
   bson_iter_t iter;
   bson_oid_t oid;
   bson_t other = BSON_INITIALIZER;
   bson_t *doc;
   bson_t sub = BSON_INITIALIZER;
   bool r;
   int i;

   bson_oid_init (&oid, NULL);

   doc = BCON_NEW ("double",
                   BCON_DOUBLE (123.4),
                   "utf8",
                   "this is my string",
                   "document",
                   BCON_DOCUMENT (&sub),
                   "array",
                   BCON_DOCUMENT (&sub),
                   "binary",
                   BCON_BIN (BSON_SUBTYPE_BINARY, raw, sizeof raw),
                   "undefined",
                   BCON_UNDEFINED,
                   "oid",
                   BCON_OID (&oid),
                   "bool",
                   BCON_BOOL (true),
                   "datetime",
                   BCON_DATE_TIME (12345678),
                   "null",
                   BCON_NULL,
                   "regex",
                   BCON_REGEX ("^hello", "i"),
                   "dbpointer",
                   BCON_DBPOINTER ("test.test", &oid),
                   "code",
                   BCON_CODE ("var a = function() {}"),
                   "symbol",
                   BCON_SYMBOL ("my_symbol"),
                   "codewscope",
                   BCON_CODEWSCOPE ("var a = 1;", &sub),
                   "int32",
                   BCON_INT32 (1234),
                   "timestamp",
                   BCON_TIMESTAMP (1234, 4567),
                   "int64",
                   BCON_INT32 (4321),
                   "maxkey",
                   BCON_MAXKEY,
                   "minkey",
                   BCON_MINKEY);

   r = bson_iter_init (&iter, doc);
   BSON_ASSERT (r);

   for (i = 0; i < 20; i++) {
      r = bson_iter_next (&iter);
      BSON_ASSERT (r);

      value = bson_iter_value (&iter);
      BSON_ASSERT (value);

      bson_value_copy (value, &copy);

      r = bson_append_value (&other, bson_iter_key (&iter), -1, &copy);
      BSON_ASSERT (r);

      bson_value_destroy (&copy);
   }

   r = bson_iter_next (&iter);
   BSON_ASSERT (!r);

   bson_destroy (doc);
   bson_destroy (&other);
}